

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_data_into_fd.c
# Opt level: O0

int pad_to(archive *a,int fd,int can_lseek,size_t nulls_size,char *nulls,int64_t target_offset,
          int64_t actual_offset)

{
  uint *puVar1;
  ssize_t sVar2;
  size_t in_RCX;
  int in_EDX;
  int in_ESI;
  archive *in_RDI;
  void *in_R8;
  long in_R9;
  __off_t in_stack_00000008;
  ssize_t bytes_written;
  size_t to_write;
  size_t local_38;
  int local_4;
  
  if (in_EDX == 0) {
    for (; in_stack_00000008 < in_R9; in_stack_00000008 = sVar2 + in_stack_00000008) {
      local_38 = in_RCX;
      if (in_R9 < (long)(in_stack_00000008 + in_RCX)) {
        local_38 = in_R9 - in_stack_00000008;
      }
      sVar2 = write(in_ESI,in_R8,local_38);
      if (sVar2 < 0) {
        puVar1 = (uint *)__errno_location();
        archive_set_error(in_RDI,(int)(ulong)*puVar1,"Write error");
        return -0x1e;
      }
    }
    local_4 = 0;
  }
  else {
    in_stack_00000008 = lseek(in_ESI,in_R9 - in_stack_00000008,1);
    if (in_stack_00000008 == in_R9) {
      local_4 = 0;
    }
    else {
      puVar1 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar1,"Seek error");
      local_4 = -0x1e;
    }
  }
  return local_4;
}

Assistant:

static int
pad_to(struct archive *a, int fd, int can_lseek,
    size_t nulls_size, const char *nulls,
    int64_t target_offset, int64_t actual_offset)
{
	size_t to_write;
	ssize_t bytes_written;

	if (can_lseek) {
		actual_offset = lseek(fd,
		    target_offset - actual_offset, SEEK_CUR);
		if (actual_offset != target_offset) {
			archive_set_error(a, errno, "Seek error");
			return (ARCHIVE_FATAL);
		}
		return (ARCHIVE_OK);
	}
	while (target_offset > actual_offset) {
		to_write = nulls_size;
		if (target_offset < actual_offset + (int64_t)nulls_size)
			to_write = (size_t)(target_offset - actual_offset);
		bytes_written = write(fd, nulls, to_write);
		if (bytes_written < 0) {
			archive_set_error(a, errno, "Write error");
			return (ARCHIVE_FATAL);
		}
		actual_offset += bytes_written;
	}
	return (ARCHIVE_OK);
}